

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<float_const&,float_const&,float_const&,bool_const&>
               (string *s,char *fmt,float *v,float *args,float *args_1,bool *args_2)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  string *in_RCX;
  float *in_RDX;
  string *in_RDI;
  char *in_R8;
  float *in_R9;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  string local_278 [24];
  string *in_stack_fffffffffffffda0;
  char **in_stack_fffffffffffffda8;
  char **in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  string local_230 [32];
  stringstream local_210 [16];
  undefined1 local_200 [24];
  char *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  LogLevel in_stack_fffffffffffffe34;
  float in_stack_fffffffffffffe7c;
  string local_88 [53];
  byte local_53;
  byte local_52;
  byte local_51;
  string local_50 [16];
  bool *in_stack_ffffffffffffffc0;
  float *in_stack_ffffffffffffffc8;
  
  copyToFormatString(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  lVar2 = std::__cxx11::string::find((char)local_50,0x2a);
  local_51 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_50,0x73);
  local_52 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_50,100);
  local_53 = lVar2 != -1;
  if ((local_51 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
             in_stack_fffffffffffffe18);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe7c);
    std::__cxx11::string::operator+=(in_RDI,local_88);
    std::__cxx11::string::~string(local_88);
  }
  else {
    if ((local_53 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
               in_stack_fffffffffffffe18);
    }
    if ((local_52 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                 in_stack_fffffffffffffe18);
      }
      std::__cxx11::string::c_str();
      formatOne<float_const&>(in_stack_fffffffffffffdb8,(float *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_278);
      std::__cxx11::string::~string(local_278);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_210);
      std::ostream::operator<<(local_200,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_230);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
      std::__cxx11::stringstream::~stringstream(local_210);
    }
  }
  stringPrintfRecursive<float_const&,float_const&,bool_const&>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}